

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InliningDecider.cpp
# Opt level: O1

uint __thiscall
InliningDecider::InlinePolymorphicCallSite
          (InliningDecider *this,FunctionBody *inliner,ProfileId profiledCallSiteId,
          FunctionBody **functionBodyArray,uint functionBodyArrayLength,bool *canInlineArray,
          uint recursiveInlineDepth)

{
  FunctionBody *pFVar1;
  code *pcVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  undefined4 *puVar6;
  DynamicProfileInfo *this_00;
  FunctionInfo *pFVar7;
  undefined4 extraout_var;
  char16 *pcVar8;
  undefined4 extraout_var_00;
  char16 *pcVar9;
  uint uVar10;
  uint uVar11;
  ulong uVar12;
  wchar local_118 [4];
  char16 debugStringBuffer [42];
  wchar local_b8 [4];
  char16 debugStringBuffer2 [42];
  bool local_31 [8];
  bool isConstructorCall;
  ulong uVar13;
  
  uVar13 = (ulong)functionBodyArrayLength;
  if (inliner == (FunctionBody *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/InliningDecider.cpp"
                       ,0xaf,"(inliner)","inliner");
    if (!bVar3) goto LAB_005647b7;
    *puVar6 = 0;
  }
  if (inliner->profiledCallSiteCount <= profiledCallSiteId) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/InliningDecider.cpp"
                       ,0xb0,"(profiledCallSiteId < inliner->GetProfiledCallSiteCount())",
                       "profiledCallSiteId < inliner->GetProfiledCallSiteCount()");
    if (!bVar3) goto LAB_005647b7;
    *puVar6 = 0;
  }
  if (functionBodyArray == (FunctionBody **)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/InliningDecider.cpp"
                       ,0xb1,"(functionBodyArray)","functionBodyArray");
    if (!bVar3) goto LAB_005647b7;
    *puVar6 = 0;
  }
  this_00 = Js::FunctionBody::GetAnyDynamicProfileInfo(inliner);
  if (this_00 == (DynamicProfileInfo *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/InliningDecider.cpp"
                       ,0xb4,"(profileData)","profileData");
    if (!bVar3) goto LAB_005647b7;
    *puVar6 = 0;
  }
  bVar3 = Js::DynamicProfileInfo::GetPolymorphicCallSiteInfo
                    (this_00,inliner,profiledCallSiteId,local_31,functionBodyArray,
                     functionBodyArrayLength);
  uVar10 = 0;
  if (bVar3) {
    if (functionBodyArrayLength == 0) {
      uVar10 = 0;
      uVar13 = 0;
    }
    else {
      uVar12 = 0;
      uVar10 = 0;
      do {
        if (functionBodyArray[uVar12] == (FunctionBody *)0x0) {
          uVar13 = uVar12;
          if ((uint)uVar12 < 2) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
            *puVar6 = 1;
            bVar3 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/InliningDecider.cpp"
                               ,0xc3,"(inlineeCount >= 2)",
                               "There are at least two polymorphic call site");
            if (!bVar3) goto LAB_005647b7;
            *puVar6 = 0;
          }
          break;
        }
        pFVar7 = Inline(this,inliner,
                        (functionBodyArray[uVar12]->super_ParseableFunctionInfo).super_FunctionProxy
                        .functionInfo.ptr,local_31[0],true,false,0,profiledCallSiteId,
                        recursiveInlineDepth,false);
        if (pFVar7 != (FunctionInfo *)0x0) {
          canInlineArray[uVar12] = true;
          uVar10 = uVar10 + 1;
        }
        uVar12 = uVar12 + 1;
      } while (functionBodyArrayLength != (uint)uVar12);
    }
    uVar11 = (uint)uVar13;
    if (uVar11 == uVar10) {
      return uVar11;
    }
    uVar10 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)inliner);
    if ((inliner->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr ==
        (FunctionInfo *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar6 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/../Runtime/Base/FunctionBody.h"
                         ,0x4c1,"(GetFunctionInfo())","GetFunctionInfo()");
      if (!bVar3) goto LAB_005647b7;
      *puVar6 = 0;
    }
    bVar3 = Js::Phases::IsEnabled
                      ((Phases *)&DAT_015bbe90,PartialPolymorphicInlinePhase,uVar10,
                       ((inliner->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr)
                       ->functionId);
    uVar10 = 0;
    if ((!bVar3) && (this->isLoopBody == false)) {
      uVar10 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)this->topFunc);
      pFVar1 = this->topFunc;
      if ((pFVar1->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr ==
          (FunctionInfo *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar6 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/../Runtime/Base/FunctionBody.h"
                           ,0x4c1,"(GetFunctionInfo())","GetFunctionInfo()");
        if (!bVar3) {
LAB_005647b7:
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        *puVar6 = 0;
      }
      bVar3 = Js::Phases::IsEnabled
                        ((Phases *)&DAT_015d3490,InlinePhase,uVar10,
                         ((pFVar1->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr
                         )->functionId);
      uVar10 = uVar11;
      if (bVar3) {
        iVar4 = (*(functionBodyArray[uVar11 - 1]->super_ParseableFunctionInfo).super_FunctionProxy.
                  super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject
                  [7])();
        pcVar8 = Js::FunctionProxy::GetDebugNumberSet
                           ((FunctionProxy *)functionBodyArray[uVar11 - 1],(wchar (*) [42])local_118
                           );
        iVar5 = (*(inliner->super_ParseableFunctionInfo).super_FunctionProxy.super_FinalizableObject
                  .super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[7])(inliner);
        pcVar9 = Js::FunctionProxy::GetDebugNumberSet
                           ((FunctionProxy *)inliner,(wchar (*) [42])local_b8);
        Output::Print(L"Partial inlining of polymorphic call: %s (%s)\tCaller: %s (%s)\n",
                      CONCAT44(extraout_var,iVar4),pcVar8,CONCAT44(extraout_var_00,iVar5),pcVar9);
        Output::Flush();
      }
    }
  }
  return uVar10;
}

Assistant:

uint InliningDecider::InlinePolymorphicCallSite(Js::FunctionBody *const inliner, const Js::ProfileId profiledCallSiteId,
    Js::FunctionBody** functionBodyArray, uint functionBodyArrayLength, bool* canInlineArray, uint recursiveInlineDepth)
{
    Assert(inliner);
    Assert(profiledCallSiteId < inliner->GetProfiledCallSiteCount());
    Assert(functionBodyArray);

    const auto profileData = inliner->GetAnyDynamicProfileInfo();
    Assert(profileData);

    bool isConstructorCall;
    if (!profileData->GetPolymorphicCallSiteInfo(inliner, profiledCallSiteId, &isConstructorCall, functionBodyArray, functionBodyArrayLength))
    {
        return 0;
    }

    uint inlineeCount = 0;
    uint actualInlineeCount  = 0;

    for (inlineeCount = 0; inlineeCount < functionBodyArrayLength; inlineeCount++)
    {
        if (!functionBodyArray[inlineeCount])
        {
            AssertMsg(inlineeCount >= 2, "There are at least two polymorphic call site");
            break;
        }
        if (Inline(inliner, functionBodyArray[inlineeCount]->GetFunctionInfo(), isConstructorCall, true /*isPolymorphicCall*/, false /*isCallback*/, 0, profiledCallSiteId, recursiveInlineDepth, false))
        {
            canInlineArray[inlineeCount] = true;
            actualInlineeCount++;
        }
    }
    if (inlineeCount != actualInlineeCount)
    {
        // We generate polymorphic dispatch and call even if there are no inlinees as it's seen to provide a perf boost
        // Skip loop bodies for now as we do not handle re-jit scenarios for the bailouts from them
        if (!PHASE_OFF(Js::PartialPolymorphicInlinePhase, inliner) && !this->isLoopBody)
        {
#if defined(DBG_DUMP) || defined(ENABLE_DEBUG_CONFIG_OPTIONS)
            char16 debugStringBuffer[MAX_FUNCTION_BODY_DEBUG_STRING_SIZE];
            char16 debugStringBuffer2[MAX_FUNCTION_BODY_DEBUG_STRING_SIZE];
#endif
            INLINE_TESTTRACE(_u("Partial inlining of polymorphic call: %s (%s)\tCaller: %s (%s)\n"),
                functionBodyArray[inlineeCount - 1]->GetDisplayName(), functionBodyArray[inlineeCount - 1]->GetDebugNumberSet(debugStringBuffer),
                inliner->GetDisplayName(),
                inliner->GetDebugNumberSet(debugStringBuffer2));
        }
        else
        {
            return 0;
        }
    }
    return inlineeCount;
}